

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.cc
# Opt level: O0

string * tinyusdz::fmt::format(string *__return_storage_ptr__,string *in)

{
  string *in_local;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)in);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in) { return in; }